

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O1

bool cmCMakePresetsGraphInternal::PresetVectorStringHelper
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *out,Value *value,cmJSONState *state)

{
  bool bVar1;
  int iVar2;
  cmJSONState *local_48;
  Value *local_40;
  code *local_38;
  undefined8 uStack_30;
  code *local_28;
  code *pcStack_20;
  
  if (PresetVectorStringHelper(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,Json::Value_const*,cmJSONState*)
      ::helper_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&PresetVectorStringHelper(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,Json::Value_const*,cmJSONState*)
                                 ::helper_abi_cxx11_);
    if (iVar2 != 0) {
      uStack_30 = 0;
      local_38 = cmCMakePresetsErrors::INVALID_PRESET;
      pcStack_20 = std::
                   _Function_handler<void_(const_Json::Value_*,_cmJSONState_*),_void_(*)(const_Json::Value_*,_cmJSONState_*)>
                   ::_M_invoke;
      local_28 = std::
                 _Function_handler<void_(const_Json::Value_*,_cmJSONState_*),_void_(*)(const_Json::Value_*,_cmJSONState_*)>
                 ::_M_manager;
      cmJSONHelperBuilder::
      VectorFilter<std::__cxx11::string,bool(*)(std::__cxx11::string&,Json::Value_const*,cmJSONState*),cmJSONHelperBuilder::Vector<std::__cxx11::string,bool(*)(std::__cxx11::string&,Json::Value_const*,cmJSONState*)>(std::function<void(Json::Value_const*,cmJSONState*)>,bool(*)(std::__cxx11::string&,Json::Value_const*,cmJSONState*))::_lambda(std::__cxx11::string_const&)_1_>
                (&PresetVectorStringHelper(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,Json::Value_const*,cmJSONState*)
                  ::helper_abi_cxx11_,(cmJSONHelperBuilder *)&local_38,PresetStringHelper);
      if (local_28 != (code *)0x0) {
        (*local_28)(&local_38,&local_38,3);
      }
      __cxa_atexit(std::_Function_base::~_Function_base,
                   &PresetVectorStringHelper(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,Json::Value_const*,cmJSONState*)
                    ::helper_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&PresetVectorStringHelper(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,Json::Value_const*,cmJSONState*)
                           ::helper_abi_cxx11_);
    }
  }
  local_48 = state;
  local_40 = value;
  if (PresetVectorStringHelper(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,Json::Value_const*,cmJSONState*)
      ::helper_abi_cxx11_.super__Function_base._M_manager != (_Manager_type)0x0) {
    bVar1 = (*PresetVectorStringHelper(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,Json::Value_const*,cmJSONState*)
              ::helper_abi_cxx11_._M_invoker)
                      ((_Any_data *)
                       &PresetVectorStringHelper(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,Json::Value_const*,cmJSONState*)
                        ::helper_abi_cxx11_,out,&local_40,&local_48);
    return bVar1;
  }
  std::__throw_bad_function_call();
}

Assistant:

bool PresetVectorStringHelper(std::vector<std::string>& out,
                              const Json::Value* value, cmJSONState* state)
{
  static auto const helper = JSONHelperBuilder::Vector<std::string>(
    cmCMakePresetsErrors::INVALID_PRESET,
    cmCMakePresetsGraphInternal::PresetStringHelper);
  return helper(out, value, state);
}